

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalPatternSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPatternSyntax,slang::syntax::ExpressionSyntax&,slang::syntax::MatchesClauseSyntax*&>
          (BumpAllocator *this,ExpressionSyntax *args,MatchesClauseSyntax **args_1)

{
  MatchesClauseSyntax *pMVar1;
  ConditionalPatternSyntax *pCVar2;
  
  pCVar2 = (ConditionalPatternSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalPatternSyntax *)this->endPtr < pCVar2 + 1) {
    pCVar2 = (ConditionalPatternSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pCVar2 + 1);
  }
  pMVar1 = *args_1;
  (pCVar2->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pCVar2->super_SyntaxNode).kind = ConditionalPattern;
  (pCVar2->expr).ptr = args;
  pCVar2->matchesClause = pMVar1;
  (args->super_SyntaxNode).parent = &pCVar2->super_SyntaxNode;
  if (pMVar1 != (MatchesClauseSyntax *)0x0) {
    (pMVar1->super_SyntaxNode).parent = &pCVar2->super_SyntaxNode;
  }
  return pCVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }